

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_data_source_get_range_in_pcm_frames
               (ma_data_source *pDataSource,ma_uint64 *pRangeBegInFrames,
               ma_uint64 *pRangeEndInFrames)

{
  if (pRangeBegInFrames != (ma_uint64 *)0x0) {
    *pRangeBegInFrames = 0;
  }
  if (pRangeEndInFrames != (ma_uint64 *)0x0) {
    *pRangeEndInFrames = 0;
  }
  if (pDataSource != (ma_data_source *)0x0) {
    if (pRangeBegInFrames != (ma_uint64 *)0x0) {
      *pRangeBegInFrames = *(ma_uint64 *)((long)pDataSource + 8);
    }
    if (pRangeEndInFrames != (ma_uint64 *)0x0) {
      *pRangeEndInFrames = *(ma_uint64 *)((long)pDataSource + 0x10);
    }
  }
  return;
}

Assistant:

MA_API void ma_data_source_get_range_in_pcm_frames(const ma_data_source* pDataSource, ma_uint64* pRangeBegInFrames, ma_uint64* pRangeEndInFrames)
{
    const ma_data_source_base* pDataSourceBase = (const ma_data_source_base*)pDataSource;

    if (pRangeBegInFrames != NULL) {
        *pRangeBegInFrames = 0;
    }
    if (pRangeEndInFrames != NULL) {
        *pRangeEndInFrames = 0;
    }

    if (pDataSource == NULL) {
        return;
    }

    if (pRangeBegInFrames != NULL) {
        *pRangeBegInFrames = pDataSourceBase->rangeBegInFrames;
    }

    if (pRangeEndInFrames != NULL) {
        *pRangeEndInFrames = pDataSourceBase->rangeEndInFrames;
    }
}